

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitStore(BinaryInstWriter *this,Store *curr)

{
  uint8_t uVar1;
  byte bVar2;
  BasicType BVar3;
  BufferWithRandomAccess *pBVar4;
  address64_t alignment;
  address64_t offset;
  U32LEB local_20;
  U32LEB local_1c;
  Store *local_18;
  Store *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (Store *)this;
  if ((curr->isAtomic & 1U) == 0) {
    BVar3 = wasm::Type::getBasic(&curr->valueType);
    switch(BVar3) {
    case none:
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x18c);
    case i32:
      uVar1 = local_18->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,':');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,';');
      }
      else {
        if (uVar1 != '\x04') {
          abort();
        }
        BufferWithRandomAccess::operator<<(this->o,'6');
      }
      break;
    case i64:
      switch(local_18->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'<');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'=');
        break;
      default:
        abort();
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'>');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'7');
      }
      break;
    case f32:
      if (local_18->bytes == '\x02') {
        pBVar4 = BufferWithRandomAccess::operator<<(this->o,-4);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x31);
        BufferWithRandomAccess::operator<<(pBVar4,local_1c);
      }
      else {
        if (local_18->bytes != '\x04') {
          handle_unreachable("invalid store size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x17f);
        }
        BufferWithRandomAccess::operator<<(this->o,'8');
      }
      break;
    case f64:
      BufferWithRandomAccess::operator<<(this->o,'9');
      break;
    case v128:
      pBVar4 = BufferWithRandomAccess::operator<<(this->o,-3);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0xb);
      BufferWithRandomAccess::operator<<(pBVar4,local_20);
    }
  }
  else {
    BufferWithRandomAccess::operator<<(this->o,-2);
    BVar3 = wasm::Type::getBasic(&local_18->valueType);
    if (BVar3 == i32) {
      uVar1 = local_18->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,'\x19');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'\x1a');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid store size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x19d);
        }
        BufferWithRandomAccess::operator<<(this->o,'\x17');
      }
    }
    else {
      if (BVar3 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1b5);
      }
      switch(local_18->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'\x1b');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'\x1c');
        break;
      default:
        handle_unreachable("invalid store size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1b0);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'\x1d');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'\x18');
      }
    }
  }
  alignment = wasm::Address::operator_cast_to_unsigned_long(&local_18->align);
  bVar2 = local_18->bytes;
  offset = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
  emitMemoryAccess(this,alignment,(ulong)bVar2,offset,(Name)(local_18->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitStore(Store* curr) {
  if (!curr->isAtomic) {
    switch (curr->valueType.getBasic()) {
      case Type::i32: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I32StoreMem8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I32StoreMem16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I32StoreMem);
            break;
          default:
            abort();
        }
        break;
      }
      case Type::i64: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I64StoreMem8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I64StoreMem16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I64StoreMem32);
            break;
          case 8:
            o << int8_t(BinaryConsts::I64StoreMem);
            break;
          default:
            abort();
        }
        break;
      }
      case Type::f32: {
        switch (curr->bytes) {
          case 2:
            o << int8_t(BinaryConsts::MiscPrefix)
              << U32LEB(BinaryConsts::F32_F16StoreMem);
            break;
          case 4:
            o << int8_t(BinaryConsts::F32StoreMem);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      case Type::f64:
        o << int8_t(BinaryConsts::F64StoreMem);
        break;
      case Type::v128:
        o << int8_t(BinaryConsts::SIMDPrefix)
          << U32LEB(BinaryConsts::V128Store);
        break;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    o << int8_t(BinaryConsts::AtomicPrefix);
    switch (curr->valueType.getBasic()) {
      case Type::i32: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I32AtomicStore8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I32AtomicStore16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I32AtomicStore);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      case Type::i64: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I64AtomicStore8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I64AtomicStore16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I64AtomicStore32);
            break;
          case 8:
            o << int8_t(BinaryConsts::I64AtomicStore);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  emitMemoryAccess(curr->align, curr->bytes, curr->offset, curr->memory);
}